

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O0

void __thiscall flatbuffers::FlatCompiler::ValidateOptions(FlatCompiler *this,FlatCOptions *options)

{
  size_type_conflict sVar1;
  ulong uVar2;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  FlatCOptions *local_20;
  IDLOptions *opts;
  FlatCOptions *options_local;
  FlatCompiler *this_local;
  
  local_20 = options;
  opts = &options->opts;
  options_local = (FlatCOptions *)this;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&options->filenames);
  if (sVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"missing input files",&local_41);
    Error(this,&local_40,false,true);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  if (((local_20->opts).proto_mode & 1U) == 0) {
    if ((((opts[1].go_import.field_2._M_local_buf[1] & 1U) == 0) &&
        (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) != 0)) &&
       (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"no options: specify at least one generator.",&local_a1);
      Error(this,&local_a0,true,true);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator(&local_a1);
    }
  }
  else if ((opts[1].go_import.field_2._M_local_buf[1] & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"cannot generate code directly from .proto files",&local_79);
    Error(this,&local_78,true,true);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  if ((((local_20->opts).cs_gen_json_serializer & 1U) != 0) &&
     (((local_20->opts).generate_object_based_api & 1U) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,
               "--cs-gen-json-serializer requires --gen-object-api to be set as well.",&local_c9);
    Error(this,&local_c8,true,true);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
  }
  return;
}

Assistant:

void FlatCompiler::ValidateOptions(const FlatCOptions &options) {
  const IDLOptions &opts = options.opts;

  if (!options.filenames.size()) Error("missing input files", false, true);

  if (opts.proto_mode) {
    if (options.any_generator)
      Error("cannot generate code directly from .proto files", true);
  } else if (!options.any_generator && options.conform_to_schema.empty() &&
             options.annotate_schema.empty()) {
    Error("no options: specify at least one generator.", true);
  }

  if (opts.cs_gen_json_serializer && !opts.generate_object_based_api) {
    Error(
        "--cs-gen-json-serializer requires --gen-object-api to be set as "
        "well.");
  }
}